

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

int encode_mcu_AC_refine_prepare
              (JCOEF *block,int *jpeg_natural_order_start,int Sl,int Al,JCOEF *absvalues,
              size_t *bits)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar7 = 0;
  uVar4 = (ulong)(uint)Sl;
  if (Sl < 1) {
    uVar4 = uVar7;
  }
  uVar3 = 0;
  uVar5 = 0;
  uVar8 = 0;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    uVar9 = (uint)block[jpeg_natural_order_start[uVar7]];
    uVar2 = -uVar9;
    if (0 < (int)uVar9) {
      uVar2 = uVar9;
    }
    bVar1 = (byte)Al & 0x1f;
    uVar6 = uVar2 >> bVar1;
    if (uVar2 >> bVar1 != 0) {
      uVar5 = uVar5 | 1L << (uVar7 & 0x3f);
      uVar8 = uVar8 | (ulong)(((int)uVar9 >> 0x1f) + 1) << ((byte)uVar7 & 0x3f);
    }
    absvalues[uVar7] = (JCOEF)uVar6;
    if (uVar6 == 1) {
      uVar3 = uVar7 & 0xffffffff;
    }
  }
  *bits = uVar5;
  bits[1] = uVar8;
  return (int)uVar3;
}

Assistant:

METHODDEF(int)
encode_mcu_AC_refine_prepare(const JCOEF *block,
                             const int *jpeg_natural_order_start, int Sl,
                             int Al, JCOEF *absvalues, size_t *bits)
{
  register int k, temp, temp2;
  int EOB = 0;
  size_t zerobits = 0U, signbits = 0U;
  int Sl0 = Sl;

#if SIZEOF_SIZE_T == 4
  if (Sl0 > 32)
    Sl0 = 32;
#endif

  COMPUTE_ABSVALUES_AC_REFINE(Sl0, 0);

  bits[0] = zerobits;
#if SIZEOF_SIZE_T == 8
  bits[1] = signbits;
#else
  bits[2] = signbits;

  zerobits = 0U;
  signbits = 0U;

  if (Sl > 32) {
    Sl -= 32;
    jpeg_natural_order_start += 32;
    absvalues += 32;

    COMPUTE_ABSVALUES_AC_REFINE(Sl, 32);
  }

  bits[1] = zerobits;
  bits[3] = signbits;
#endif

  return EOB;
}